

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O0

void __thiscall
CorUnix::CSynchCache<CorUnix::_ThreadApcInfoNode>::CSynchCache
          (CSynchCache<CorUnix::_ThreadApcInfoNode> *this,int iMaxDepth)

{
  int local_24;
  _USynchCacheStackNode *local_20;
  int local_14;
  CSynchCache<CorUnix::_ThreadApcInfoNode> *pCStack_10;
  int iMaxDepth_local;
  CSynchCache<CorUnix::_ThreadApcInfoNode> *this_local;
  
  local_20 = (_USynchCacheStackNode *)0x0;
  local_14 = iMaxDepth;
  pCStack_10 = this;
  Volatile<CorUnix::CSynchCache<CorUnix::_ThreadApcInfoNode>::_USynchCacheStackNode_*>::Volatile
            (&this->m_pHead,&local_20);
  local_24 = 0;
  Volatile<int>::Volatile(&this->m_iDepth,&local_24);
  this->m_iMaxDepth = local_14;
  this->m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&this->m_cs);
  if (this->m_iMaxDepth < 0) {
    this->m_iMaxDepth = 0;
  }
  return;
}

Assistant:

CSynchCache(int iMaxDepth = MaxDepth) :             
            m_pHead(NULL),
            m_iDepth(0),
            m_iMaxDepth(iMaxDepth)
#ifdef _DEBUG
            ,m_iMaxTrackedDepth(0)
#endif
        { 
            InternalInitializeCriticalSection(&m_cs);
            if (m_iMaxDepth < 0)
            {
                m_iMaxDepth = 0;
            }
        }